

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::NodeArray::printWithComma(NodeArray *this,OutputStream *S)

{
  size_t sVar1;
  size_t sVar2;
  size_t AfterComma;
  size_t local_30;
  size_t BeforeComma;
  size_t Idx;
  OutputStream *pOStack_18;
  bool FirstElement;
  OutputStream *S_local;
  NodeArray *this_local;
  
  Idx._7_1_ = 1;
  pOStack_18 = S;
  S_local = (OutputStream *)this;
  for (BeforeComma = 0; BeforeComma != this->NumElements; BeforeComma = BeforeComma + 1) {
    local_30 = OutputStream::getCurrentPosition(pOStack_18);
    if ((Idx._7_1_ & 1) == 0) {
      StringView::StringView((StringView *)&AfterComma,", ");
      OutputStream::operator+=(pOStack_18,_AfterComma);
    }
    sVar1 = OutputStream::getCurrentPosition(pOStack_18);
    Node::print(this->Elements[BeforeComma],pOStack_18);
    sVar2 = OutputStream::getCurrentPosition(pOStack_18);
    if (sVar1 == sVar2) {
      OutputStream::setCurrentPosition(pOStack_18,local_30);
    }
    else {
      Idx._7_1_ = 0;
    }
  }
  return;
}

Assistant:

void printWithComma(OutputStream &S) const {
    bool FirstElement = true;
    for (size_t Idx = 0; Idx != NumElements; ++Idx) {
      size_t BeforeComma = S.getCurrentPosition();
      if (!FirstElement)
        S += ", ";
      size_t AfterComma = S.getCurrentPosition();
      Elements[Idx]->print(S);

      // Elements[Idx] is an empty parameter pack expansion, we should erase the
      // comma we just printed.
      if (AfterComma == S.getCurrentPosition()) {
        S.setCurrentPosition(BeforeComma);
        continue;
      }

      FirstElement = false;
    }
  }